

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O3

void __thiscall
tao::pegtl::
memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
memory_input<char_const(&)[1]>
          (memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
           *this,string *in_string,char (*in_source) [1])

{
  pointer pcVar1;
  size_type sVar2;
  size_t sVar3;
  
  pcVar1 = (in_string->_M_dataplus)._M_p;
  sVar2 = in_string->_M_string_length;
  *(pointer *)this = pcVar1;
  *(pointer *)(this + 8) = pcVar1;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 1;
  *(undefined8 *)(this + 0x20) = 0;
  *(pointer *)(this + 0x28) = pcVar1 + sVar2;
  *(memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
    **)(this + 0x30) = this + 0x40;
  sVar3 = strlen(*in_source);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this + 0x30),in_source,in_source + sVar3);
  return;
}

Assistant:

memory_input( const std::string& in_string, T&& in_source ) noexcept( std::is_nothrow_constructible< Source, T&& >::value )
            : memory_input( in_string.data(), in_string.size(), std::forward< T >( in_source ) )
         {
         }